

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O3

QDateTime __thiscall
QLocale::toDateTime(QLocale *this,QString *string,FormatType format,QCalendar cal)

{
  undefined4 in_register_00000014;
  int in_R8D;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  dateTimeFormat(&local_48,(QLocale *)string,(FormatType)cal.d_ptr);
  toDateTime(this,string,(QString *)CONCAT44(in_register_00000014,format),
             (QCalendarBackend *)&local_48,in_R8D);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDateTime)(Data)this;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QLocale::toDateTime(const QString &string, FormatType format, QCalendar cal) const
{
    return toDateTime(string, dateTimeFormat(format), cal, DefaultTwoDigitBaseYear);
}